

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcp
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  utf32_t uVar1;
  utf32_t uVar2;
  uint uVar3;
  SrcUnit *srcEnd;
  C *src;
  C *src_00;
  size_t i;
  SrcUnit *srcEnd_00;
  ulong uVar4;
  ulong uVar5;
  Result RVar6;
  Result RVar7;
  utf32_t buffer1 [64];
  utf32_t buffer2 [64];
  DstUnit aDStack_38 [2];
  
  src = this->m_p;
  srcEnd = src + this->m_length;
  src_00 = string->m_p;
  srcEnd_00 = src_00 + string->m_length;
  do {
    if ((srcEnd <= src) || (srcEnd_00 <= src_00)) {
      uVar3 = 0xffffffff;
      if (srcEnd_00 <= src_00) {
        uVar3 = (uint)(src < srcEnd);
      }
      return uVar3;
    }
    RVar6 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
            ::convert(buffer1,buffer2,src,srcEnd,0xfffd);
    src = RVar6.m_src;
    RVar7 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
            ::convert(buffer2,aDStack_38,src_00,srcEnd_00,0xfffd);
    src_00 = RVar7.m_src;
    uVar5 = (long)RVar6.m_dst - (long)buffer1 >> 2;
    uVar4 = (long)RVar7.m_dst - (long)buffer2 >> 2;
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    uVar5 = 0;
    while (uVar4 != uVar5) {
      uVar1 = enc::toCaseFolded(buffer1[uVar5]);
      uVar2 = enc::toCaseFolded(buffer2[uVar5]);
      if (uVar1 < uVar2) {
        return -1;
      }
      uVar5 = uVar5 + 1;
      if (uVar2 < uVar1) {
        return 1;
      }
    }
  } while( true );
}

Assistant:

int
	cmpIgnoreCase_pcp(const StringRef& string) const {
		typedef enc::Convert<enc::Utf32, Encoding> Convert;
		typedef enc::ConvertResult<utf32_t, C> ConvertResult;

		const C* p1 = m_p;
		const C* end1 = p1 + m_length;
		const C* p2 = string.m_p;
		const C* end2 = p2 + string.m_length;

		while (p1 < end1 && p2 < end2) {
			utf32_t buffer1[64];
			utf32_t buffer2[64];

			ConvertResult result1 = Convert::convert(buffer1, buffer1 + countof(buffer1), p1, end1);
			ConvertResult result2 = Convert::convert(buffer2, buffer2 + countof(buffer2), p2, end2);

			size_t length1 = result1.m_dst - buffer1;
			size_t length2 = result2.m_dst - buffer2;
			size_t length = AXL_MIN(length1, length2);

			for (size_t i = 0; i < length; i++) {
				utf32_t c1 = enc::toCaseFolded(buffer1[i]);
				utf32_t c2 = enc::toCaseFolded(buffer2[i]);

				if (c1 < c2)
					return -1;
				else if (c1 > c2)
					return 1;
			}

			p1 = result1.m_src;
			p2 = result2.m_src;
		}

		return
			p2 < end2 ? -1 :
			p1 < end1 ? 1 : 0;
	}